

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

uchar * mcmrealo(mcmcxdef *cctx,mcmon cliobj,ushort newsize)

{
  ushort n;
  ushort uVar1;
  ushort n_00;
  undefined2 uVar2;
  mcmodef *pmVar3;
  int e;
  uchar *__dest;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  ushort siz;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  errcxdef *ctx;
  long *plVar7;
  mcmcx1def *ctx_00;
  mcmon nxt;
  mcmcx1def *local_180;
  int local_174;
  mcmcxdef *local_170;
  errdef fr_;
  
  local_174 = (int)CONCAT62(in_register_00000012,newsize);
  local_180 = cctx->mcmcxgl;
  n = cctx->mcmcxmtb[CONCAT62(in_register_00000032,cliobj) >> 8 & 0xffffff]
      [(uint)CONCAT62(in_register_00000032,cliobj) & 0xff];
  pmVar3 = local_180->mcmcxtab[n >> 8];
  uVar5 = (ulong)((n & 0xff) << 5);
  uVar1 = *(ushort *)((long)&pmVar3->mcmoflg + uVar5);
  if ((uVar1 & 4) == 0) {
    mcmlck(cctx,cliobj);
  }
  local_170 = cctx;
  fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  ctx_00 = local_180;
  if (fr_.errcode != 0) {
    local_180->mcmcxerr->errcxptr = fr_.errprv;
    if ((uVar1 & 4) == 0) {
      mcmunlck(local_170,cliobj);
    }
    errrse1(local_180->mcmcxerr,&fr_);
  }
  siz = (ushort)(local_174 + 7U) & 0xfff8;
  plVar7 = (long *)((long)&pmVar3->mcmoptr + uVar5);
  fr_.errprv = local_180->mcmcxerr->errcxptr;
  local_180->mcmcxerr->errcxptr = &fr_;
  uVar4 = local_174 + 7U & 0xfff8;
  uVar1 = *(ushort *)(plVar7 + 3);
  if (uVar1 <= uVar4) {
    n_00 = *(ushort *)(*plVar7 + (ulong)uVar1);
    nxt = n_00;
    if ((((n_00 == 0xffff) || (pmVar3 = local_180->mcmcxtab[n_00 >> 8], pmVar3 == (mcmodef *)0x0))
        || (bVar6 = (byte)n_00, (pmVar3[bVar6].mcmoflg & 0x80) == 0)) ||
       ((int)(uint)pmVar3[bVar6].mcmosiz < (int)(uVar4 - uVar1))) {
      if (*(char *)((long)plVar7 + 0x16) != '\x01') {
        ctx = local_180->mcmcxerr;
        e = 5;
LAB_00216ab4:
        errsigf(ctx,"TADS",e);
      }
      __dest = mcmalo0(local_170,siz,&nxt,0xffff,1);
      if (nxt == 0xffff) {
        ctx = local_180->mcmcxerr;
        e = 0xc;
        goto LAB_00216ab4;
      }
      memcpy(__dest,(void *)*plVar7,(ulong)*(ushort *)(plVar7 + 3));
      ctx_00 = local_180;
      pmVar3 = local_180->mcmcxtab[nxt >> 8];
      uVar5 = (ulong)((nxt & 0xff) << 5);
      uVar2 = *(undefined2 *)((long)&pmVar3->mcmosiz + uVar5);
      *(long *)((long)&pmVar3->mcmoptr + uVar5) = *plVar7;
      *(short *)((long)&pmVar3->mcmosiz + uVar5) = (short)plVar7[3];
      *plVar7 = (long)__dest;
      *(undefined2 *)(plVar7 + 3) = uVar2;
      *(ushort *)(__dest + -8) = n;
      *(mcmon *)(*(long *)((long)&pmVar3->mcmoptr + uVar5) + -8) = nxt;
      mcmgunlck(local_180,nxt);
      mcmgfre(ctx_00,nxt);
      goto LAB_00216a05;
    }
    *(ushort *)(plVar7 + 3) = uVar1 + pmVar3[bVar6].mcmosiz + 8;
    mcmunl(local_180,n_00,&local_180->mcmcxfre);
    pmVar3[bVar6].mcmonxt = ctx_00->mcmcxunu;
    ctx_00->mcmcxunu = n_00;
    pmVar3[bVar6].mcmoflg = 0;
  }
  mcmsplt(ctx_00,n,siz);
LAB_00216a05:
  ctx_00->mcmcxerr->errcxptr = fr_.errprv;
  return (uchar *)*plVar7;
}

Assistant:

uchar *mcmrealo(mcmcxdef *cctx, mcmon cliobj, ushort newsize)
{
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      obj = mcmc2g(cctx, cliobj); 
    mcmodef   *o = mcmgobje(ctx, obj);
    mcmon      nxt;
    mcmodef   *nxto;
    uchar     *p;
    int        local_lock;
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    newsize = osrndsz(newsize);
    
    /* make sure the object is locked, and note if we locked it */
    if ((local_lock = !(o->mcmoflg & MCMOFLOCK)) != 0)
        (void)mcmlck(cctx, cliobj);
    
    ERRBEGIN(ctx->mcmcxerr)
    
    if (newsize < o->mcmosiz)
        mcmsplt(ctx, obj, newsize);            /* smaller; just split block */
    else
    {
        /* see if there's a free block after this block */
        p = o->mcmoptr;
        nxt = *(mcmon *)(p + o->mcmosiz);
        nxto = (nxt == MCMONINV) ? (mcmodef *)0 : mcmgobje(ctx, nxt);
        
        if (nxto && ((nxto->mcmoflg & MCMOFFREE)
                     && nxto->mcmosiz >= newsize - o->mcmosiz))
        {
            /* sanity check - make sure heap and page table agree */
            assert(nxto->mcmoptr == p + o->mcmosiz + osrndsz(sizeof(mcmon)));
            /* annex the free block */
            o->mcmosiz += nxto->mcmosiz + osrndsz(sizeof(mcmon));
            /* move the free block to the unused list */
            mcmunl(ctx, nxt, &ctx->mcmcxfre);
            nxto->mcmonxt = ctx->mcmcxunu;
            ctx->mcmcxunu = nxt;
            nxto->mcmoflg = 0;
            
            /* split the newly grown block if necessary */
            mcmsplt(ctx, obj, newsize);
        }
        else
        {
            /* can't annex; allocate new memory and copy */
            
            if (o->mcmolcnt != 1)           /* if anyone else has a lock... */
                errsig(ctx->mcmcxerr, ERR_REALCK);      /* we can't move it */
    
            p = mcmalo0(cctx, newsize, &nxt, MCMONINV, TRUE);
            if (nxt == MCMONINV) errsig(ctx->mcmcxerr, ERR_NOMEM2);
            memcpy(p, o->mcmoptr, (size_t)o->mcmosiz);
            
            /* adjust the object entries */
            nxto = mcmgobje(ctx, nxt);          /* get pointer to new entry */
            newsize = nxto->mcmosiz;        /* get actual size of new block */
            nxto->mcmoptr = o->mcmoptr;   /* copy current block info to new */
            nxto->mcmosiz = o->mcmosiz;
            o->mcmoptr = p;        /* copy new block info to original entry */
            o->mcmosiz = newsize;
            
            /* now fix up the heap pointers, and free the temp object */
            *(mcmon *)(p - osrndsz(sizeof(mcmon))) = obj;
            *(mcmon *)(nxto->mcmoptr - osrndsz(sizeof(mcmon))) = nxt;
            mcmgunlck(ctx, nxt);
            mcmgfre(ctx, nxt);
        }
    }
    
    ERRCLEAN(ctx->mcmcxerr)
        /* release our lock, if we had to obtain one */
        if (local_lock) mcmunlck(cctx, cliobj);
    ERRENDCLN(ctx->mcmcxerr)
    
    /* return the address of the object */
    return(o->mcmoptr);
}